

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O1

void __thiscall MyInfo::MyInfo(MyInfo *this)

{
  char *pcVar1;
  undefined8 uVar2;
  char *__s;
  
  ASDCP::WriterInfo::WriterInfo(&this->super_WriterInfo);
  uVar2 = MyInfo::default_ProductUUID_Data._8_8_;
  *(undefined8 *)(this->super_WriterInfo).ProductUUID = MyInfo::default_ProductUUID_Data._0_8_;
  *(undefined8 *)((this->super_WriterInfo).ProductUUID + 8) = uVar2;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_WriterInfo).CompanyName,0,
             (char *)(this->super_WriterInfo).CompanyName._M_string_length,0x112aab);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_WriterInfo).ProductName,0,
             (char *)(this->super_WriterInfo).ProductName._M_string_length,0x112ab4);
  __s = (char *)ASDCP::Version();
  pcVar1 = (char *)(this->super_WriterInfo).ProductVersion._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_WriterInfo).ProductVersion,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

MyInfo()
  {
      static byte_t default_ProductUUID_Data[UUIDlen] =
      { 0x7d, 0x83, 0x6e, 0x16, 0x37, 0xc7, 0x4c, 0x22,
	0xb2, 0xe0, 0x46, 0xa7, 0x17, 0xe8, 0x4f, 0x42 };

      memcpy(ProductUUID, default_ProductUUID_Data, UUIDlen);
      CompanyName = "WidgetCo";
      ProductName = "asdcp-wrap";
      ProductVersion = ASDCP::Version();
  }